

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O2

UINT8 ymf278b_r(void *info,UINT8 offset)

{
  byte bVar1;
  UINT32 address;
  UINT8 UVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  
  uVar3 = CONCAT71(in_register_00000031,offset) & 0xffffffff;
  switch(uVar3) {
  case 0:
    break;
  case 1:
  case 3:
    uVar3 = (ulong)*(byte *)((long)info + 0x648);
    break;
  default:
    uVar3 = 0;
    emu_logf((DEV_LOGGER *)((long)info + 8),'\x04',"unexpected read at offset %X from ymf278b\n",
             offset);
    break;
  case 5:
    if ((*(byte *)((long)info + 0x644) & 2) == 0) {
      uVar3 = 0;
    }
    else {
      bVar1 = *(byte *)((long)info + 0x646);
      if (bVar1 == 6) {
        uVar3 = 0xff;
        if ((*(byte *)((long)info + 0x546) & 1) != 0) {
          address = *(UINT32 *)((long)info + 0x50c);
          UVar2 = ymf278b_readMem((YMF278BChip *)info,address);
          *(UINT32 *)((long)info + 0x50c) = address + 1;
          return UVar2;
        }
      }
      else if (bVar1 == 2) {
        uVar3 = (ulong)(*(byte *)((long)info + 0x546) & 0x1f | 0x20);
      }
      else {
        uVar3 = (ulong)*(byte *)((long)info + (ulong)bVar1 + 0x544);
      }
    }
  }
  return (UINT8)uVar3;
}

Assistant:

static UINT8 ymf278b_r(void *info, UINT8 offset)
{
	YMF278BChip *chip = (YMF278BChip *)info;
	UINT8 ret = 0;

	switch (offset)
	{
		// status register
		case 0:
		{
			// bits 0 and 1 are only valid if NEW2 is set
			//UINT8 newbits = 0;
			//if (chip->exp & 2)
			//	newbits = (chip->status_ld << 1) | chip->status_busy;

			//ret = newbits | chip->current_irq | (chip->irq_line == ASSERT_LINE ? 0x80 : 0x00);
			ret = ymf278b_readStatus(chip);
			break;
		}

		// FM regs can be read too (on contrary to what the datasheet says)
		case 1:
		case 3:
			// but they're not implemented here yet
			// This may be incorrect, but it makes the mbwave moonsound detection in msx drivers pass.
			ret = chip->last_fm_data;
			break;

		// PCM regs
		case 5:
			// only accessible if NEW2 is set
			if (~chip->exp & 2)
				break;

			ret = ymf278b_readReg(chip, chip->port_C);
			break;

		default:
			emu_logf(&chip->logger, DEVLOG_DEBUG, "unexpected read at offset %X from ymf278b\n", offset);
			break;
	}

	return ret;
}